

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall
jsonnet::internal::LiteralString::LiteralString
          (LiteralString *this,LocationRange *lr,Fodder *open_fodder,UString *value,
          TokenKind token_kind,string *block_indent,string *block_term_indent)

{
  pointer pcVar1;
  pointer pcVar2;
  
  AST::AST(&this->super_AST,lr,AST_LITERAL_STRING,open_fodder);
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__LiteralString_0023dd80;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::u32string::_M_construct<char32_t*>
            ((u32string *)&this->value,pcVar1,pcVar1 + value->_M_string_length);
  this->tokenKind = token_kind;
  (this->blockIndent)._M_dataplus._M_p = (pointer)&(this->blockIndent).field_2;
  pcVar2 = (block_indent->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->blockIndent,pcVar2,pcVar2 + block_indent->_M_string_length);
  (this->blockTermIndent)._M_dataplus._M_p = (pointer)&(this->blockTermIndent).field_2;
  pcVar2 = (block_term_indent->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->blockTermIndent,pcVar2,pcVar2 + block_term_indent->_M_string_length);
  return;
}

Assistant:

LiteralString(const LocationRange &lr, const Fodder &open_fodder, const UString &value,
                  TokenKind token_kind, const std::string &block_indent,
                  const std::string &block_term_indent)
        : AST(lr, AST_LITERAL_STRING, open_fodder),
          value(value),
          tokenKind(token_kind),
          blockIndent(block_indent),
          blockTermIndent(block_term_indent)
    {
    }